

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTCue_GetVariable(FACTCue *pCue,uint16_t nIndex,float *nValue)

{
  code *pcVar1;
  int iVar2;
  uint32_t uVar3;
  byte *pbVar4;
  float *in_RDX;
  ushort in_SI;
  long *in_RDI;
  SDL_AssertState sdl_assert_state_1;
  SDL_AssertState sdl_assert_state;
  FACTVariable *var;
  uint32_t local_4;
  
  if (in_RDI == (long *)0x0) {
    *in_RDX = 0.0;
    local_4 = 1;
  }
  else if (in_SI == 0xffff) {
    local_4 = 1;
  }
  else {
    FAudio_PlatformLockMutex((FAudioMutex)0x116f07);
    pbVar4 = (byte *)(*(long *)(*(long *)*in_RDI + 0x58) + (ulong)in_SI * 0x10);
    do {
      if ((*pbVar4 & 1) != 0) goto LAB_00116f80;
      iVar2 = SDL_ReportAssertion(&FACTCue_GetVariable::sdl_assert_data,"FACTCue_GetVariable",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT.c"
                                  ,0xb03);
    } while (iVar2 == 0);
    if (iVar2 == 1) {
      pcVar1 = (code *)swi(3);
      uVar3 = (*pcVar1)();
      return uVar3;
    }
LAB_00116f80:
    do {
      if ((*pbVar4 & 4) != 0) goto LAB_00116fd3;
      iVar2 = SDL_ReportAssertion(&FACTCue_GetVariable::sdl_assert_data_1,"FACTCue_GetVariable",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT.c"
                                  ,0xb04);
    } while (iVar2 == 0);
    if (iVar2 == 1) {
      pcVar1 = (code *)swi(3);
      uVar3 = (*pcVar1)();
      return uVar3;
    }
LAB_00116fd3:
    if (in_SI == 0) {
      *in_RDX = (float)*(byte *)(*(long *)(*in_RDI + 0x48) + 0x13 +
                                (ulong)*(ushort *)((long)in_RDI + 0x12) * 0x14);
    }
    else {
      *in_RDX = *(float *)(in_RDI[6] + (ulong)in_SI * 4);
    }
    FAudio_PlatformUnlockMutex((FAudioMutex)0x117038);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint32_t FACTCue_GetVariable(
	FACTCue *pCue,
	uint16_t nIndex,
	float *nValue
) {
	FACTVariable *var;
	if (pCue == NULL)
	{
		*nValue = 0.0f;
		return 1;
	}

	if (nIndex == FACTINDEX_INVALID)
	{
		return 1;
	}

	FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);

	var = &pCue->parentBank->parentEngine->variables[nIndex];
	FAudio_assert(var->accessibility & 0x01);
	FAudio_assert(var->accessibility & 0x04);

	if (nIndex == 0) /* NumCueInstances */
	{
		*nValue = pCue->parentBank->cues[pCue->index].instanceCount;
	}
	else
	{
		*nValue = pCue->variableValues[nIndex];
	}

	FAudio_PlatformUnlockMutex(pCue->parentBank->parentEngine->apiLock);
	return 0;
}